

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_freeallobjects(lua_State *L)

{
  global_State *g;
  global_State *pgVar1;
  
  g = L->l_G;
  separatetobefnz(g,1);
  pgVar1 = L->l_G;
  while (pgVar1->tobefnz != (GCObject *)0x0) {
    GCTM(L,0);
  }
  g->currentwhite = '\x03';
  g->gckind = '\0';
  sweeplist(L,&g->finobj,0xffffffffffffffff);
  sweeplist(L,&g->allgc,0xffffffffffffffff);
  sweeplist(L,&g->fixedgc,0xffffffffffffffff);
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  deletelist(L, g->finobj, NULL);
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}